

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O0

Lookups * verona::lookdown(Lookups *__return_storage_ptr__,Lookup *lookup,Node *id,Node *ta,
                          NodeSet *visited)

{
  size_t *this;
  anon_class_16_2_d806c64c __unary_op;
  bool bVar1;
  element_type *peVar2;
  element_type *this_00;
  Location *loc;
  pointer ppVar3;
  Node *pNVar4;
  pair<std::_Rb_tree_const_iterator<std::shared_ptr<trieste::NodeDef>_>,_bool> pVar5;
  bool local_3a9;
  Token local_310;
  Token TStack_308;
  Token TStack_300;
  initializer_list<trieste::Token> local_2f8;
  Token local_2e8;
  _Base_ptr local_2e0;
  _Rb_tree_const_iterator<verona::Lookup> local_2d8;
  set<std::shared_ptr<trieste::NodeDef>,_std::owner_less<void>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
  local_2d0;
  shared_ptr<trieste::NodeDef> local_2a0;
  shared_ptr<trieste::NodeDef> local_290;
  undefined1 local_280 [8];
  Lookups ldefs;
  undefined1 local_240 [8];
  Lookup l;
  shared_ptr<trieste::NodeDef> *t;
  iterator __end9;
  iterator __begin9;
  element_type *__range9;
  Token local_1d0;
  Token local_1c8;
  shared_ptr<trieste::NodeDef> local_1c0;
  Lookup local_1b0;
  Token local_168;
  Token TStack_160;
  initializer_list<trieste::Token> local_158;
  Token local_148;
  Token local_140;
  _Self local_138;
  _Self local_130;
  iterator it;
  Token local_120;
  WFLookup local_118;
  Token local_f8;
  insert_iterator<std::set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>_>
  local_f0;
  Lookup *local_e0;
  Node *local_d8;
  _Base_ptr local_d0;
  insert_iterator<std::set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>_>
  local_c8;
  __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
  local_b8;
  __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
  local_b0;
  undefined1 local_98 [8];
  Nodes defs;
  Token local_78;
  Token TStack_70;
  Token TStack_68;
  initializer_list<trieste::Token> local_60;
  _Base_ptr local_50;
  undefined1 local_48;
  _Base_ptr local_40;
  pair<std::_Rb_tree_const_iterator<std::shared_ptr<trieste::NodeDef>_>,_bool> inserted;
  NodeSet *visited_local;
  Node *ta_local;
  Node *id_local;
  Lookup *lookup_local;
  Lookups *result;
  
  inserted._8_8_ = visited;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)lookup);
            if (!bVar1) {
              memset(__return_storage_ptr__,0,0x30);
              ::std::set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>
              ::set(__return_storage_ptr__);
              return __return_storage_ptr__;
            }
            pVar5 = ::std::
                    set<std::shared_ptr<trieste::NodeDef>,_std::owner_less<void>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                    ::insert(visited,&lookup->def);
            local_50 = (_Base_ptr)pVar5.first._M_node;
            local_48 = pVar5.second;
            local_40 = local_50;
            inserted.first._M_node._0_1_ = local_48;
            if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              memset(__return_storage_ptr__,0,0x30);
              ::std::set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>
              ::set(__return_storage_ptr__);
              return __return_storage_ptr__;
            }
            peVar2 = ::std::
                     __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)lookup);
            trieste::Token::Token(&local_78,(TokenDef *)Class);
            trieste::Token::Token(&TStack_70,(TokenDef *)Trait);
            trieste::Token::Token(&TStack_68,(TokenDef *)Function);
            local_60._M_array = &local_78;
            local_60._M_len = 3;
            bVar1 = trieste::NodeDef::in(peVar2,&local_60);
            if (bVar1) {
              defs.
              super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
              ::std::set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>
              ::set(__return_storage_ptr__);
              peVar2 = ::std::
                       __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)lookup);
              this_00 = ::std::
                        __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)id);
              loc = trieste::NodeDef::location(this_00);
              trieste::NodeDef::lookdown((Nodes *)local_98,peVar2,loc);
              local_b0._M_current =
                   (shared_ptr<trieste::NodeDef> *)
                   ::std::
                   vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   ::begin((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                            *)local_98);
              local_b8._M_current =
                   (shared_ptr<trieste::NodeDef> *)
                   ::std::
                   vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   ::end((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                          *)local_98);
              local_d0 = (_Base_ptr)
                         ::std::
                         set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>
                         ::begin(__return_storage_ptr__);
              local_c8 = ::std::
                         inserter<std::set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>_>
                                   (__return_storage_ptr__,
                                    (__range_iter_t<std::set<verona::Lookup>_>)local_d0);
              __unary_op.ta = ta;
              __unary_op.lookup = lookup;
              local_e0 = lookup;
              local_d8 = ta;
              local_f0 = ::std::
                         transform<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,std::insert_iterator<std::set<verona::Lookup,std::less<verona::Lookup>,std::allocator<verona::Lookup>>>,verona::lookdown(verona::Lookup&,std::shared_ptr<trieste::NodeDef>,std::shared_ptr<trieste::NodeDef>,std::set<std::shared_ptr<trieste::NodeDef>,std::owner_less<void>,std::allocator<std::shared_ptr<trieste::NodeDef>>>)::__0>
                                   (local_b0,local_b8,local_c8,__unary_op);
              defs.
              super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
              ::std::
              vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
              ::~vector((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                         *)local_98);
              if ((defs.
                   super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
                return __return_storage_ptr__;
              }
              ::std::set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>
              ::~set(__return_storage_ptr__);
              return __return_storage_ptr__;
            }
            trieste::Token::Token(&local_f8,(TokenDef *)TypeAlias);
            bVar1 = trieste::operator==(&lookup->def,&local_f8);
            if (!bVar1) break;
            trieste::Token::Token(&local_120,(TokenDef *)Type);
            trieste::operator/(&local_118,&lookup->def,&local_120);
            pNVar4 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_118);
            ::std::shared_ptr<trieste::NodeDef>::operator=(&lookup->def,pNVar4);
            trieste::wf::detail::WFLookup::~WFLookup(&local_118);
          }
          trieste::Token::Token((Token *)&it,(TokenDef *)TypeParam);
          bVar1 = trieste::operator==(&lookup->def,(Token *)&it);
          if (!bVar1) break;
          local_130._M_node =
               (_Base_ptr)
               ::std::
               map<std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
               ::find(&lookup->bindings,&lookup->def);
          local_138._M_node =
               (_Base_ptr)
               ::std::
               map<std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
               ::end(&lookup->bindings);
          bVar1 = ::std::operator==(&local_130,&local_138);
          local_3a9 = true;
          if (!bVar1) {
            ppVar3 = ::std::
                     _Rb_tree_iterator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>
                     ::operator->(&local_130);
            trieste::Token::Token(&local_140,(TokenDef *)TypeParamBind);
            local_3a9 = trieste::operator==(&ppVar3->second,&local_140);
          }
          if (local_3a9 != false) {
            memset(__return_storage_ptr__,0,0x30);
            ::std::set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>::
            set(__return_storage_ptr__);
            return __return_storage_ptr__;
          }
          ppVar3 = ::std::
                   _Rb_tree_iterator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>
                   ::operator->(&local_130);
          ::std::shared_ptr<trieste::NodeDef>::operator=(&lookup->def,&ppVar3->second);
        }
        trieste::Token::Token(&local_148,(TokenDef *)Type);
        bVar1 = trieste::operator==(&lookup->def,&local_148);
        if (!bVar1) break;
        peVar2 = ::std::
                 __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)lookup);
        pNVar4 = trieste::NodeDef::front(peVar2);
        ::std::shared_ptr<trieste::NodeDef>::operator=(&lookup->def,pNVar4);
      }
      peVar2 = ::std::
               __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)lookup);
      trieste::Token::Token(&local_168,(TokenDef *)FQType);
      trieste::Token::Token(&TStack_160,(TokenDef *)FQFunction);
      local_158._M_array = &local_168;
      local_158._M_len = 2;
      bVar1 = trieste::NodeDef::in(peVar2,&local_158);
      if (!bVar1) break;
      ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_1c0,&lookup->def);
      resolve_fq(&local_1b0,&local_1c0);
      Lookup::operator=(lookup,&local_1b0);
      Lookup::~Lookup(&local_1b0);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_1c0);
    }
    trieste::Token::Token(&local_1c8,(TokenDef *)TypeView);
    bVar1 = trieste::operator==(&lookup->def,&local_1c8);
    if (!bVar1) break;
    peVar2 = ::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)lookup);
    pNVar4 = trieste::NodeDef::back(peVar2);
    ::std::shared_ptr<trieste::NodeDef>::operator=(&lookup->def,pNVar4);
  }
  trieste::Token::Token(&local_1d0,(TokenDef *)TypeIsect);
  bVar1 = trieste::operator==(&lookup->def,&local_1d0);
  if (bVar1) {
    ::std::set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>::set
              (__return_storage_ptr__);
    peVar2 = ::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)lookup);
    __end9 = trieste::NodeDef::begin(peVar2);
    t = (shared_ptr<trieste::NodeDef> *)trieste::NodeDef::end(peVar2);
    while (bVar1 = __gnu_cxx::
                   operator==<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                             (&__end9,(__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                                       *)&t), ((bVar1 ^ 0xffU) & 1) != 0) {
      l._64_8_ = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                 ::operator*(&__end9);
      this = &ldefs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      ::std::shared_ptr<trieste::NodeDef>::shared_ptr
                ((shared_ptr<trieste::NodeDef> *)this,(shared_ptr<trieste::NodeDef> *)l._64_8_);
      Lookup::make((Lookup *)local_240,lookup,(Node *)this);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr
                ((shared_ptr<trieste::NodeDef> *)
                 &ldefs._M_t._M_impl.super__Rb_tree_header._M_node_count);
      ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_290,id);
      ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_2a0,ta);
      ::std::
      set<std::shared_ptr<trieste::NodeDef>,_std::owner_less<void>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
      ::set(&local_2d0,visited);
      lookdown((Lookups *)local_280,(Lookup *)local_240,&local_290,&local_2a0,&local_2d0);
      ::std::
      set<std::shared_ptr<trieste::NodeDef>,_std::owner_less<void>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
      ::~set(&local_2d0);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_2a0);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_290);
      local_2d8._M_node =
           (_Base_ptr)
           ::std::set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>::
           begin((set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_> *)
                 local_280);
      local_2e0 = (_Base_ptr)
                  ::std::
                  set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>::
                  end((set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>
                       *)local_280);
      ::std::set<verona::Lookup,std::less<verona::Lookup>,std::allocator<verona::Lookup>>::
      insert<std::_Rb_tree_const_iterator<verona::Lookup>>
                ((set<verona::Lookup,std::less<verona::Lookup>,std::allocator<verona::Lookup>> *)
                 __return_storage_ptr__,local_2d8,(_Rb_tree_const_iterator<verona::Lookup>)local_2e0
                );
      ::std::set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>::~set
                ((set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_> *)
                 local_280);
      Lookup::~Lookup((Lookup *)local_240);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
      ::operator++(&__end9);
    }
    return __return_storage_ptr__;
  }
  trieste::Token::Token(&local_2e8,(TokenDef *)TypeUnion);
  bVar1 = trieste::operator==(&lookup->def,&local_2e8);
  if (!bVar1) {
    peVar2 = ::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)lookup);
    trieste::Token::Token(&local_310,(TokenDef *)TypeList);
    trieste::Token::Token(&TStack_308,(TokenDef *)TypeTuple);
    trieste::Token::Token(&TStack_300,(TokenDef *)TypeVar);
    local_2f8._M_array = &local_310;
    local_2f8._M_len = 3;
    bVar1 = trieste::NodeDef::in(peVar2,&local_2f8);
    if (!bVar1) {
      memset(__return_storage_ptr__,0,0x30);
      ::std::set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>::set
                (__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    memset(__return_storage_ptr__,0,0x30);
    ::std::set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>::set
              (__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  memset(__return_storage_ptr__,0,0x30);
  ::std::set<verona::Lookup,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>::set
            (__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Lookups lookdown(Lookup& lookup, Node id, Node ta, NodeSet visited)
  {
    while (true)
    {
      // Stop on a failed lookup.
      if (!lookup.def)
        return {};

      // Check if we've visited this node before. If so, we've found a cycle.
      auto inserted = visited.insert(lookup.def);
      if (!inserted.second)
        return {};

      if (lookup.def->in({Class, Trait, Function}))
      {
        // Return all lookdowns in the found class, trait, or function.
        Lookups result;
        auto defs = lookup.def->lookdown(id->location());

        std::transform(
          defs.begin(),
          defs.end(),
          std::inserter(result, result.begin()),
          [&](auto& def) {
            auto l = lookup.make(def);
            apply_typeargs(l, ta);
            return l;
          });

        return result;
      }
      else if (lookup.def == TypeAlias)
      {
        // Replace the def with our type alias and try again.
        lookup.def = lookup.def / Type;
      }
      else if (lookup.def == TypeParam)
      {
        // Replace the typeparam with the bound typearg and try again.
        auto it = lookup.bindings.find(lookup.def);

        // Except in testing, there should always be a binding. If it's bound
        // to itself, then we're done.
        if ((it == lookup.bindings.end()) || (it->second == TypeParamBind))
          return {};

        lookup.def = it->second;
      }
      // The remainder of cases arise from a Use, a TypeAlias, or a TypeParam.
      // They will all result in some number of name resolutions.
      else if (lookup.def == Type)
      {
        // Replace the def with the content of the type and try again.
        // Use `front()` instead of `def / Type` to allow looking up in `use`
        // directives before Type is no longer a sequence.
        lookup.def = lookup.def->front();
      }
      else if (lookup.def->in({FQType, FQFunction}))
      {
        // Resolve the name and try again.
        lookup = resolve_fq(lookup.def);
      }
      else if (lookup.def == TypeView)
      {
        // Replace the def with the rhs of the view and try again.
        lookup.def = lookup.def->back();
      }
      else if (lookup.def == TypeIsect)
      {
        // Return everything we find.
        Lookups result;

        for (auto& t : *lookup.def)
        {
          auto l = lookup.make(t);
          auto ldefs = lookdown(l, id, ta, visited);
          result.insert(ldefs.begin(), ldefs.end());
        }

        return result;
      }
      else if (lookup.def == TypeUnion)
      {
        // TODO: return only things that are identical in all disjunctions
        return {};
      }
      else if (lookup.def->in({TypeList, TypeTuple, TypeVar}))
      {
        // Nothing to do here.
        return {};
      }
      else
      {
        // This type isn't resolved yet.
        return {};
      }
    }
  }